

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::crate::CrateReader::ReadStringArray
          (CrateReader *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *d)

{
  StreamReader *pSVar1;
  uint64_t uVar2;
  ulong uVar3;
  bool bVar4;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  size_t nbytes;
  size_t __n;
  uint64_t n;
  optional<tinyusdz::Token> v;
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> ivalue;
  ostringstream ss_e;
  uint64_t local_258;
  optional<tinyusdz::Token> local_250;
  long *local_228;
  long local_220;
  long local_218 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_208;
  string *local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> local_1e0;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258 = 0;
  bVar4 = StreamReader::read8(this->_sr,&local_258);
  if (bVar4) {
    if ((this->_config).maxArrayElements < local_258) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"operator()",10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x3b6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar8 = "Too many array elements.";
      lVar7 = 0x18;
      goto LAB_001b4dfa;
    }
    uVar6 = local_258 * 4 + this->_memoryUsage;
    this->_memoryUsage = uVar6;
    if ((this->_config).maxMemoryBudget < uVar6) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"operator()",10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x3b9);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar8 = "Reached to max memory budget.";
      lVar7 = 0x1d;
      goto LAB_001b4dfa;
    }
    ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::vector
              (&local_1e0,local_258,(allocator_type *)local_1a8);
    pSVar1 = this->_sr;
    uVar2 = pSVar1->idx_;
    __n = pSVar1->length_ - uVar2;
    if (uVar2 + local_258 * 4 <= pSVar1->length_) {
      __n = local_258 << 2;
    }
    if (__n - 1 < local_258 << 2) {
      memcpy(local_1e0.
             super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>.
             _M_impl.super__Vector_impl_data._M_start,pSVar1->binary_ + uVar2,__n);
      pSVar1->idx_ = pSVar1->idx_ + __n;
      uVar6 = local_258 * 8 + this->_memoryUsage;
      this->_memoryUsage = uVar6;
      if ((this->_config).maxMemoryBudget < uVar6) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"operator()",10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x3c5);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        pcVar8 = "Reached to max memory budget.";
        lVar7 = 0x1d;
        goto LAB_001b5156;
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&local_1f8,local_258);
      bVar4 = true;
      if (local_258 != 0) {
        local_200 = &this->_err;
        lVar7 = 0;
        uVar6 = 0;
        local_208 = d;
        do {
          GetStringToken(&local_250,this,
                         (Index)local_1e0.
                                super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar6].value);
          if (local_250.has_value_ == true) {
            local_228 = local_218;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_228,local_250.contained.data.__align,
                       (undefined1 *)
                       (local_250.contained._8_8_ + (long)local_250.contained.data._0_8_));
            uVar3 = (this->_config).maxMemoryBudget;
            uVar9 = this->_memoryUsage + local_220;
            this->_memoryUsage = uVar9;
            if (uVar3 < uVar9) {
              ::std::__cxx11::ostringstream::ostringstream(local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"operator()",10);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x3ca);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Reached to max memory budget.",0x1d);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append((char *)local_200,(ulong)local_1c8);
              if (local_1c8 != local_1b8) {
                operator_delete(local_1c8,local_1b8[0] + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
              ::std::ios_base::~ios_base(local_138);
            }
            else {
              ::std::__cxx11::string::_M_assign
                        ((string *)
                         ((long)&((local_1f8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar7));
            }
            if (local_228 != local_218) {
              operator_delete(local_228,local_218[0] + 1);
            }
            if (uVar3 < uVar9) {
              if ((local_250.has_value_ == true) &&
                 (local_250.contained.data.__align !=
                  (anon_struct_8_0_00000001_for___align)((long)&local_250.contained + 0x10))) {
                operator_delete((void *)local_250.contained.data._0_8_,
                                local_250.contained._16_8_ + 1);
              }
              bVar4 = false;
              d = local_208;
              goto LAB_001b51da;
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"operator()",10);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x3cd);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Invalid StringIndex.",0x14);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)local_200,(ulong)local_228);
            if (local_228 != local_218) {
              operator_delete(local_228,local_218[0] + 1);
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
            ::std::ios_base::~ios_base(local_138);
          }
          if ((local_250.has_value_ == true) &&
             (local_250.contained.data.__align !=
              (anon_struct_8_0_00000001_for___align)((long)&local_250.contained + 0x10))) {
            operator_delete((void *)local_250.contained.data._0_8_,local_250.contained._16_8_ + 1);
          }
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 0x20;
        } while (uVar6 < local_258);
        bVar4 = true;
        d = local_208;
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"operator()",10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x3c0);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar8 = "Failed to read STRING_VECTOR data.";
      lVar7 = 0x22;
LAB_001b5156:
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,lVar7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append
                ((char *)&this->_err,CONCAT71(local_250._1_7_,local_250.has_value_));
      if ((void *)CONCAT71(local_250._1_7_,local_250.has_value_) !=
          (void *)((long)&local_250.contained + 8)) {
        operator_delete((void *)CONCAT71(local_250._1_7_,local_250.has_value_),
                        local_250.contained._8_8_ + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
      ::std::ios_base::~ios_base(local_138);
      bVar4 = false;
    }
LAB_001b51da:
    if (local_1e0.
        super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e0.
                      super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e0.
                            super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e0.
                            super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (bVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)d,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_1f8);
      bVar4 = true;
      goto LAB_001b4e7e;
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"operator()",10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x3b1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar8 = "Failed to read the number of array elements.";
    lVar7 = 0x2c;
LAB_001b4dfa:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,lVar7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append
              ((char *)&this->_err,CONCAT71(local_250._1_7_,local_250.has_value_));
    if ((void *)CONCAT71(local_250._1_7_,local_250.has_value_) !=
        (void *)((long)&local_250.contained + 8)) {
      operator_delete((void *)CONCAT71(local_250._1_7_,local_250.has_value_),
                      local_250.contained._8_8_ + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    ::std::ios_base::~ios_base(local_138);
  }
  bVar4 = false;
LAB_001b4e7e:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  return bVar4;
}

Assistant:

bool CrateReader::ReadStringArray(std::vector<std::string> *d) {
  // array data is not compressed
  auto ReadFn = [this](std::vector<std::string> &result) -> bool {
    uint64_t n{0};
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }

    if (n > _config.maxArrayElements) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
    }

    CHECK_MEMORY_USAGE(size_t(n) * sizeof(crate::Index));

    std::vector<crate::Index> ivalue(static_cast<size_t>(n));

    if (!_sr->read(size_t(n) * sizeof(crate::Index),
                   size_t(n) * sizeof(crate::Index),
                   reinterpret_cast<uint8_t *>(ivalue.data()))) {
      PUSH_ERROR("Failed to read STRING_VECTOR data.");
      return false;
    }

    // reconstruct
    CHECK_MEMORY_USAGE(size_t(n) * sizeof(void *));
    result.resize(static_cast<size_t>(n));
    for (size_t i = 0; i < n; i++) {
      if (auto v = GetStringToken(ivalue[i])) {
        std::string s = v.value().str();
        CHECK_MEMORY_USAGE(s.size());
        result[i] = s;
      } else {
        PUSH_ERROR("Invalid StringIndex.");
      }
    }

    return true;
  };

  std::vector<std::string> items;
  if (!ReadFn(items)) {
    return false;
  }

  (*d) = items;

  return true;
}